

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaf2c.c
# Opt level: O0

void ga_f2cstring(char *fstring,int flength,char *cstring,int clength)

{
  int iVar1;
  bool bVar2;
  int clength_local;
  char *cstring_local;
  int flength_local;
  char *fstring_local;
  
  iVar1 = flength;
  do {
    flength_local = iVar1;
    bVar2 = false;
    if (flength_local != 0) {
      bVar2 = fstring[flength_local + -1] == ' ';
    }
    iVar1 = flength_local + -1;
  } while (bVar2);
  if (clength <= flength_local) {
    flength_local = clength + -1;
  }
  cstring[flength_local] = '\0';
  while (iVar1 = flength_local + -1, flength_local != 0) {
    cstring[iVar1] = fstring[iVar1];
    flength_local = iVar1;
  }
  return;
}

Assistant:

void ga_f2cstring(char *fstring, int flength, char *cstring, int clength)
{
    /* remove trailing blanks from fstring */
    while (flength-- && fstring[flength] == ' ') ;

    /* the postdecrement above went one too far */
    flength++;

    /* truncate fstring to cstring size */
    if (flength >= clength) {
        flength = clength - 1;
    }

    /* ensure that cstring is NUL-terminated */
    cstring[flength] = '\0';

    /* copy fstring to cstring */
    while (flength--) {
        cstring[flength] = fstring[flength];
    }
}